

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

bool __thiscall
Liby::http::RequestParser::ParseHttpVersion(RequestParser *this,char *begin,char *end)

{
  int iVar1;
  bool bVar2;
  int length;
  char *end_local;
  char *begin_local;
  RequestParser *this_local;
  
  bVar2 = false;
  if ((begin <= end) && (bVar2 = false, begin != (char *)0x0)) {
    bVar2 = end != (char *)0x0;
  }
  if (bVar2) {
    if ((int)end - (int)begin == 8) {
      iVar1 = strncmp("HTTP/1.1",begin,8);
      if (iVar1 == 0) {
        this->http_version_major_ = 1;
        this->http_version_minor_ = 1;
      }
      else {
        iVar1 = strncmp("HTTP/1.0",begin,8);
        if (iVar1 != 0) {
          this->progress_ = 8;
          return false;
        }
        this->http_version_major_ = 1;
        this->http_version_minor_ = 0;
      }
      this->progress_ = 4;
      this_local._7_1_ = true;
    }
    else {
      this->progress_ = 8;
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("begin <= end && begin && end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                ,0xbc,"bool Liby::http::RequestParser::ParseHttpVersion(const char *, const char *)"
               );
}

Assistant:

bool RequestParser::ParseHttpVersion(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    int length = end - begin;
    if (length != 8) {
        progress_ = InvalidVersion;
        return false;
    }
    if (!std::strncmp("HTTP/1.1", begin, 8)) {
        http_version_major_ = 1;
        http_version_minor_ = 1;
    } else if (!std::strncmp("HTTP/1.0", begin, 8)) {
        http_version_major_ = 1;
        http_version_minor_ = 0;
    } else {
        progress_ = InvalidVersion;
        return false;
    }
    progress_ = ParsingHeaders;
    return true;
}